

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

int ndiGetGXSingleStray(ndicapi *pol,int port,double *coord)

{
  char cVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  
  uVar4 = port - 0x31;
  iVar2 = 1;
  if (uVar4 < 3) {
    cVar1 = pol->GxSingleStray[uVar4][0];
    iVar2 = 1;
    if ((cVar1 != '\0') && (cVar1 != 'D')) {
      if (cVar1 == 'M') {
        iVar2 = 2;
      }
      else {
        lVar3 = ndiSignedToLong(pol->GxSingleStray[uVar4],7);
        *coord = (double)lVar3 * 0.01;
        lVar3 = ndiSignedToLong(pol->GxSingleStray[uVar4] + 7,7);
        coord[1] = (double)lVar3 * 0.01;
        lVar3 = ndiSignedToLong(pol->GxSingleStray[uVar4] + 0xe,7);
        coord[2] = (double)lVar3 * 0.01;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

ndicapiExport int ndiGetGXSingleStray(ndicapi* pol, int port, double coord[3])
{
  char* dp;

  if (port >= '1' && port <= '3')
  {
    dp = pol->GxSingleStray[port - '1'];
  }
  else
  {
    return NDI_DISABLED;
  }

  if (*dp == 'D' || *dp == '\0')
  {
    return NDI_DISABLED;
  }
  else if (*dp == 'M')
  {
    return NDI_MISSING;
  }

  coord[0] = ndiSignedToLong(&dp[0],  7) * 0.01;
  coord[1] = ndiSignedToLong(&dp[7],  7) * 0.01;
  coord[2] = ndiSignedToLong(&dp[14], 7) * 0.01;

  return NDI_OKAY;
}